

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# move.c
# Opt level: O0

Move * move_create(MOVETYPE type,SPOTTYPE fromSpotType,uchar fromSpotIndex,int fromSpotCardIndex,
                  SPOTTYPE toSpotType,uchar toSpotIndex,int toSpotCardIndex)

{
  Move *pMVar1;
  int in_ECX;
  uchar in_DL;
  SPOTTYPE in_SIL;
  MOVETYPE in_DIL;
  SPOTTYPE in_R8B;
  uchar in_R9B;
  int in_stack_00000008;
  Move *move;
  
  pMVar1 = (Move *)malloc(0x18);
  pMVar1->type = in_DIL;
  pMVar1->fromSpotType = in_SIL;
  pMVar1->fromSpotIndex = in_DL;
  pMVar1->fromSpotCardIndex = in_ECX;
  pMVar1->toSpotType = in_R8B;
  pMVar1->toSpotIndex = in_R9B;
  pMVar1->toSpotCardIndex = in_stack_00000008;
  pMVar1->movePack = (_MovePack *)0x0;
  return pMVar1;
}

Assistant:

Move * move_create(MOVETYPE type, SPOTTYPE fromSpotType, unsigned char fromSpotIndex, int fromSpotCardIndex, SPOTTYPE toSpotType, unsigned char toSpotIndex, int toSpotCardIndex)
{
	Move * move = (Move *)malloc(sizeof(Move));
	move->type = type;
	move->fromSpotType = fromSpotType;
	move->fromSpotIndex = fromSpotIndex;
	move->fromSpotCardIndex = fromSpotCardIndex;
	move->toSpotType = toSpotType;
	move->toSpotIndex = toSpotIndex;
	move->toSpotCardIndex = toSpotCardIndex;
	move->movePack = 0;

	return move;
}